

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineBase.cpp
# Opt level: O3

void __thiscall myvk::PipelineBase::~PipelineBase(PipelineBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

PipelineBase::~PipelineBase() {
	if (m_pipeline)
		vkDestroyPipeline(m_pipeline_layout_ptr->GetDevicePtr()->GetHandle(), m_pipeline, nullptr);
}